

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

_Bool hydro_equal(void *b1_,void *b2_,size_t len)

{
  uint8_t d;
  size_t i;
  uint8_t *b2;
  uint8_t *b1;
  size_t len_local;
  void *b2__local;
  void *b1__local;
  
  d = '\0';
  if (b1_ == b2_) {
    d = 0xff;
  }
  for (i = 0; i < len; i = i + 1) {
    d = d | *(byte *)((long)b1_ + i) ^ *(byte *)((long)b2_ + i);
  }
  return ((int)(d - 1) >> 8 & 1U) != 0;
}

Assistant:

bool
hydro_equal(const void *b1_, const void *b2_, size_t len)
{
    const volatile uint8_t *volatile b1 = (const volatile uint8_t *volatile) b1_;
    const uint8_t *b2                   = (const uint8_t *) b2_;
    size_t         i;
    uint8_t        d = (uint8_t) 0U;

    if (b1 == b2) {
        d = ~d;
    }
    for (i = 0U; i < len; i++) {
        d |= b1[i] ^ b2[i];
    }
    return (bool) (1 & ((d - 1) >> 8));
}